

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre_regex.cpp
# Opt level: O0

void __thiscall booster::regex::data::data(data *this,data *other)

{
  undefined8 uVar1;
  bad_alloc *this_00;
  string *in_RSI;
  string *in_RDI;
  bad_alloc *in_stack_ffffffffffffffc0;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  *(undefined4 *)(in_RDI + 0x20) = *(undefined4 *)(in_RSI + 0x20);
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = *(undefined8 *)(in_RSI + 0x38);
  *(undefined8 *)(in_RDI + 0x40) = *(undefined8 *)(in_RSI + 0x40);
  *(undefined4 *)(in_RDI + 0x48) = *(undefined4 *)(in_RSI + 0x48);
  if (*(long *)(in_RSI + 0x28) != 0) {
    uVar1 = (*_pcre_malloc)(*(undefined8 *)(in_RDI + 0x38));
    *(undefined8 *)(in_RDI + 0x28) = uVar1;
    if (*(long *)(in_RDI + 0x28) == 0) {
      uVar1 = __cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(in_stack_ffffffffffffffc0);
      __cxa_throw(uVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    memcpy(*(void **)(in_RDI + 0x28),*(void **)(in_RSI + 0x28),*(size_t *)(in_RDI + 0x38));
  }
  if (*(long *)(in_RSI + 0x30) != 0) {
    this_00 = (bad_alloc *)(*_pcre_malloc)(*(undefined8 *)(in_RDI + 0x40));
    *(bad_alloc **)(in_RDI + 0x30) = this_00;
    if (*(long *)(in_RDI + 0x30) == 0) {
      uVar1 = __cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(this_00);
      __cxa_throw(uVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    memcpy(*(void **)(in_RDI + 0x30),*(void **)(in_RSI + 0x30),*(size_t *)(in_RDI + 0x40));
  }
  return;
}

Assistant:

data(data const &other) :
			expression(other.expression),
			flags(other.flags),
			re(0),
			are(0),
			re_size(other.re_size),
			are_size(other.are_size),
			match_size(other.match_size)
		{
			try {
				if(other.re!=0) {
					re = (pcre *)(pcre_malloc(re_size));
					if(!re) {
						throw std::bad_alloc();
					}
					memcpy(re,other.re,re_size);
				}
				if(other.are!=0) {
					are = (pcre *)(pcre_malloc(are_size));
					if(!are) {
						throw std::bad_alloc();
					}
					memcpy(are,other.are,are_size);
				}
			}
			catch(...) {
				if(re) pcre_free(re);
				if(are) pcre_free(are);
				throw;
			}
		}